

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O3

int EC_POINT_dbl(EC_GROUP *group,EC_POINT *r,EC_POINT *a,BN_CTX *ctx)

{
  long lVar1;
  int iVar2;
  
  lVar1 = *(long *)group;
  if (((*(code **)(lVar1 + 0xb8) != (code *)0x0) && (lVar1 == *(long *)r)) && (lVar1 == *(long *)a))
  {
    iVar2 = (**(code **)(lVar1 + 0xb8))();
    return iVar2;
  }
  return 0;
}

Assistant:

int EC_POINT_dbl(const EC_GROUP *group, EC_POINT *r, const EC_POINT *a,
                 BN_CTX *ctx)
{
    if (group->meth->dbl == 0) {
        //ECerr(EC_F_EC_POINT_DBL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
    }
    if ((group->meth != r->meth) || (r->meth != a->meth)) {
        //ECerr(EC_F_EC_POINT_DBL, EC_R_INCOMPATIBLE_OBJECTS);
        return 0;
    }
    return group->meth->dbl(group, r, a, ctx);
}